

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall
google::base::CheckOpMessageBuilder::CheckOpMessageBuilder
          (CheckOpMessageBuilder *this,char *exprtext)

{
  ostringstream *this_00;
  size_t sVar1;
  
  this_00 = (ostringstream *)operator_new(0x178);
  std::__cxx11::ostringstream::ostringstream(this_00);
  this->stream_ = (ostringstream *)this_00;
  if (exprtext == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  else {
    sVar1 = strlen(exprtext);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,exprtext,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," (",2);
  return;
}

Assistant:

CheckOpMessageBuilder::CheckOpMessageBuilder(const char* exprtext)
    : stream_(new ostringstream) {
  *stream_ << exprtext << " (";
}